

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentStorageBuffer::prepare
          (RenderFragmentStorageBuffer *this,PrepareRenderPassContext *context)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  deInt32 dVar1;
  deUint32 viewPortWidth;
  deUint32 viewPortHeight;
  Context *pCVar2;
  DeviceInterface *deviceInterface;
  VkDevice device_00;
  VkRenderPass VVar3;
  ProgramCollection<vk::ProgramBinary> *pPVar4;
  ProgramBinary *pPVar5;
  VkDeviceSize VVar6;
  Handle<(vk::HandleType)14> *vertexShaderModule_00;
  Handle<(vk::HandleType)14> *fragmentShaderModule_00;
  Handle<(vk::HandleType)19> *pHVar7;
  Handle<(vk::HandleType)21> *pHVar8;
  Handle<(vk::HandleType)22> *pHVar9;
  undefined4 local_328 [2];
  VkWriteDescriptorSet write;
  VkDescriptorBufferInfo bufferInfo;
  RefData<vk::Handle<(vk::HandleType)22>_> local_2b0;
  undefined1 local_290 [8];
  VkDescriptorSetAllocateInfo allocateInfo;
  VkDescriptorSetLayout layout;
  RefData<vk::Handle<(vk::HandleType)21>_> local_240;
  undefined1 local_220 [8];
  VkDescriptorPoolCreateInfo createInfo;
  VkDescriptorPoolSize poolSizes;
  undefined1 auStack_1e8 [4];
  deUint32 descriptorCount;
  pointer pVStack_1e0;
  pointer local_1d8;
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  local_1c8;
  VkRenderPass local_1b0;
  undefined1 local_1a8 [8];
  VkPushConstantRange pushConstantRange;
  VkDescriptorSetLayoutBinding binding;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  string local_160;
  Move<vk::Handle<(vk::HandleType)14>_> local_140;
  RefData<vk::Handle<(vk::HandleType)14>_> local_120;
  undefined1 local_100 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentShaderModule;
  allocator<char> local_c9;
  string local_c8;
  Move<vk::Handle<(vk::HandleType)14>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_88;
  undefined1 local_68 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexShaderModule;
  deUint32 subpass;
  VkRenderPass renderPass;
  VkDevice device;
  DeviceInterface *vkd;
  PrepareRenderPassContext *context_local;
  RenderFragmentStorageBuffer *this_local;
  
  pCVar2 = PrepareRenderPassContext::getContext(context);
  deviceInterface = Context::getDeviceInterface(pCVar2);
  pCVar2 = PrepareRenderPassContext::getContext(context);
  device_00 = Context::getDevice(pCVar2);
  VVar3 = PrepareRenderPassContext::getRenderPass(context);
  vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_
       = 0;
  pPVar4 = PrepareRenderPassContext::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"render-quad.vert",&local_c9);
  pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,&local_c8);
  ::vk::createShaderModule(&local_a8,deviceInterface,device_00,pPVar5,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data.deleter.m_deviceIface._0_4_ = (int)local_88.deleter.m_deviceIface;
  data.object.m_internal = local_88.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_88.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_88.deleter.m_device;
  data.deleter.m_allocator = local_88.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_68,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pPVar4 = PrepareRenderPassContext::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"storage-buffer.frag",
             (allocator<char> *)
             ((long)&bindings.
                     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,&local_160);
  ::vk::createShaderModule(&local_140,deviceInterface,device_00,pPVar5,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_120.deleter.m_deviceIface;
  data_00.object.m_internal = local_120.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_120.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_120.deleter.m_device;
  data_00.deleter.m_allocator = local_120.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_100,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bindings.
                     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          *)&binding.pImmutableSamplers);
  VVar6 = PrepareRenderPassContext::getBufferSize(context);
  this->m_bufferSize = VVar6;
  dVar1 = PrepareRenderPassContext::getTargetWidth(context);
  this->m_targetWidth = (long)dVar1;
  dVar1 = PrepareRenderPassContext::getTargetHeight(context);
  this->m_targetHeight = (long)dVar1;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  stack0xfffffffffffffe68 = 0x700000000;
  binding.binding = 1;
  binding.descriptorType = 0x10;
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  push_back((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
             *)&binding.pImmutableSamplers,(value_type *)&pushConstantRange.size);
  pushConstantRange.stageFlags = 0xc;
  local_1a8._0_4_ = 0x10;
  local_1a8._4_4_ = 0;
  local_1b0 = VVar3;
  vertexShaderModule_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_68);
  fragmentShaderModule_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_100);
  viewPortWidth = PrepareRenderPassContext::getTargetWidth(context);
  viewPortHeight = PrepareRenderPassContext::getTargetHeight(context);
  local_1c8.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::vector(&local_1c8);
  _auStack_1e8 = (pointer)0x0;
  pVStack_1e0 = (pointer)0x0;
  local_1d8 = (pointer)0x0;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
            *)auStack_1e8);
  createPipelineWithResources
            (deviceInterface,device_00,local_1b0,0,vertexShaderModule_00,fragmentShaderModule_00,
             viewPortWidth,viewPortHeight,&local_1c8,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)auStack_1e8,
             (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              *)&binding.pImmutableSamplers,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,1,
             (VkPushConstantRange *)local_1a8,&this->m_resources);
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::~vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
             *)auStack_1e8);
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::~vector(&local_1c8);
  createInfo.pPoolSizes = (VkDescriptorPoolSize *)0x100000007;
  local_220._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 1;
  createInfo.pNext._4_4_ = 1;
  createInfo.flags = 1;
  createInfo._24_8_ = &createInfo.pPoolSizes;
  ::vk::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&layout,deviceInterface,device_00,
             (VkDescriptorPoolCreateInfo *)local_220,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_240,(Move *)&layout);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_240.deleter.m_deviceIface;
  data_01.object.m_internal = local_240.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_240.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_240.deleter.m_device;
  data_01.deleter.m_allocator = local_240.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&layout);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_resources).descriptorSetLayout.
                       super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  allocateInfo.pSetLayouts = (VkDescriptorSetLayout *)pHVar7->m_internal;
  local_290._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  allocateInfo.pNext = (void *)pHVar8->m_internal;
  allocateInfo.descriptorPool.m_internal._0_4_ = 1;
  allocateInfo._24_8_ = &allocateInfo.pSetLayouts;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferInfo.range,deviceInterface,device_00,
             (VkDescriptorSetAllocateInfo *)local_290);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2b0,(Move *)&bufferInfo.range);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_2b0.deleter.m_deviceIface;
  data_02.object.m_internal = local_2b0.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2b0.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_2b0.deleter.m_device;
  data_02.deleter.m_pool.m_internal = local_2b0.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(&this->m_descriptorSet,data_02)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferInfo.range);
  write.pTexelBufferView = (VkBufferView *)PrepareRenderPassContext::getBuffer(context);
  bufferInfo.buffer.m_internal = 0;
  bufferInfo.offset = this->m_bufferSize;
  local_328[0] = 0x23;
  write.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  write._4_4_ = 0;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  write.pNext = (void *)pHVar9->m_internal;
  write.dstSet.m_internal._0_4_ = 0;
  write.dstSet.m_internal._4_4_ = 0;
  write.dstBinding = 1;
  write.dstArrayElement = 7;
  write.descriptorCount = 0;
  write.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  write.pImageInfo = (VkDescriptorImageInfo *)&write.pTexelBufferView;
  write.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
  (*deviceInterface->_vptr_DeviceInterface[0x3e])(deviceInterface,device_00,1,local_328,0,0);
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  ~vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           *)&binding.pImmutableSamplers);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_100);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_68);
  return;
}

Assistant:

void RenderFragmentStorageBuffer::prepare (PrepareRenderPassContext& context)
{
	const vk::DeviceInterface&					vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice							device					= context.getContext().getDevice();
	const vk::VkRenderPass						renderPass				= context.getRenderPass();
	const deUint32								subpass					= 0;
	const vk::Unique<vk::VkShaderModule>		vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-quad.vert"), 0));
	const vk::Unique<vk::VkShaderModule>		fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("storage-buffer.frag"), 0));
	vector<vk::VkDescriptorSetLayoutBinding>	bindings;

	m_bufferSize	= context.getBufferSize();
	m_targetWidth	= context.getTargetWidth();
	m_targetHeight	= context.getTargetHeight();

	{
		const vk::VkDescriptorSetLayoutBinding binding =
		{
			0u,
			vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
			1,
			vk::VK_SHADER_STAGE_FRAGMENT_BIT,
			DE_NULL
		};

		bindings.push_back(binding);
	}
	const vk::VkPushConstantRange pushConstantRange =
	{
		vk::VK_SHADER_STAGE_FRAGMENT_BIT,
		0u,
		12u
	};

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), bindings, vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, 1u, &pushConstantRange, m_resources);

	{
		const deUint32							descriptorCount	= 1;
		const vk::VkDescriptorPoolSize			poolSizes		=
		{
			vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
			descriptorCount
		};
		const vk::VkDescriptorPoolCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

			descriptorCount,
			1u,
			&poolSizes,
		};

		m_descriptorPool = vk::createDescriptorPool(vkd, device, &createInfo);
	}

	{
		const vk::VkDescriptorSetLayout			layout			= *m_resources.descriptorSetLayout;
		const vk::VkDescriptorSetAllocateInfo	allocateInfo	=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,

			*m_descriptorPool,
			1,
			&layout
		};

		m_descriptorSet = vk::allocateDescriptorSet(vkd, device, &allocateInfo);

		{
			const vk::VkDescriptorBufferInfo	bufferInfo	=
			{
				context.getBuffer(),
				0u,
				m_bufferSize
			};
			const vk::VkWriteDescriptorSet		write		=
			{
				vk::VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
				DE_NULL,
				m_descriptorSet.get(),
				0u,
				0u,
				1u,
				vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
				DE_NULL,
				&bufferInfo,
				DE_NULL,
			};

			vkd.updateDescriptorSets(device, 1u, &write, 0u, DE_NULL);
		}
	}
}